

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipkinCollector.cpp
# Opt level: O0

ssize_t __thiscall
twitter::zipkin::thrift::ZipkinCollector_submitZipkinBatch_result::write
          (ZipkinCollector_submitZipkinBatch_result *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  size_type sVar4;
  reference pRVar5;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  __normal_iterator<const_twitter::zipkin::thrift::Response_*,_std::vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>_>
  local_38;
  Response *local_30;
  __normal_iterator<const_twitter::zipkin::thrift::Response_*,_std::vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>_>
  local_28;
  const_iterator _iter35;
  uint32_t xfer;
  TProtocol *oprot_local;
  ZipkinCollector_submitZipkinBatch_result *this_local;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  _iter35._M_current._4_4_ = 0;
  uVar2 = apache::thrift::protocol::TProtocol::writeStructBegin
                    (this_00,"ZipkinCollector_submitZipkinBatch_result");
  _iter35._M_current._4_4_ = uVar2 + _iter35._M_current._4_4_;
  if (((byte)this->__isset & 1) != 0) {
    uVar2 = apache::thrift::protocol::TProtocol::writeFieldBegin(this_00,"success",T_LIST,0);
    _iter35._M_current._4_4_ = uVar2 + _iter35._M_current._4_4_;
    sVar4 = std::
            vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
            ::size(&this->success);
    uVar2 = apache::thrift::protocol::TProtocol::writeListBegin(this_00,T_STRUCT,(uint32_t)sVar4);
    _iter35._M_current._4_4_ = uVar2 + _iter35._M_current._4_4_;
    __gnu_cxx::
    __normal_iterator<const_twitter::zipkin::thrift::Response_*,_std::vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>_>
    ::__normal_iterator(&local_28);
    local_30 = (Response *)
               std::
               vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
               ::begin(&this->success);
    local_28._M_current = local_30;
    while( true ) {
      local_38._M_current =
           (Response *)
           std::
           vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
           ::end(&this->success);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
      if (!bVar1) break;
      pRVar5 = __gnu_cxx::
               __normal_iterator<const_twitter::zipkin::thrift::Response_*,_std::vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>_>
               ::operator*(&local_28);
      iVar3 = (**(code **)(*(long *)pRVar5 + 0x18))(pRVar5,this_00);
      _iter35._M_current._4_4_ = iVar3 + _iter35._M_current._4_4_;
      __gnu_cxx::
      __normal_iterator<const_twitter::zipkin::thrift::Response_*,_std::vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>_>
      ::operator++(&local_28);
    }
    uVar2 = apache::thrift::protocol::TProtocol::writeListEnd(this_00);
    _iter35._M_current._4_4_ = uVar2 + _iter35._M_current._4_4_;
    uVar2 = apache::thrift::protocol::TProtocol::writeFieldEnd(this_00);
    _iter35._M_current._4_4_ = uVar2 + _iter35._M_current._4_4_;
  }
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldStop(this_00);
  _iter35._M_current._4_4_ = uVar2 + _iter35._M_current._4_4_;
  uVar2 = apache::thrift::protocol::TProtocol::writeStructEnd(this_00);
  return (ulong)(uVar2 + _iter35._M_current._4_4_);
}

Assistant:

uint32_t ZipkinCollector_submitZipkinBatch_result::write(::apache::thrift::protocol::TProtocol* oprot) const {

  uint32_t xfer = 0;

  xfer += oprot->writeStructBegin("ZipkinCollector_submitZipkinBatch_result");

  if (this->__isset.success) {
    xfer += oprot->writeFieldBegin("success", ::apache::thrift::protocol::T_LIST, 0);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->success.size()));
      std::vector<Response> ::const_iterator _iter35;
      for (_iter35 = this->success.begin(); _iter35 != this->success.end(); ++_iter35)
      {
        xfer += (*_iter35).write(oprot);
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}